

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_task.cpp
# Opt level: O1

void __thiscall duckdb::ExecutorTask::Deschedule(ExecutorTask *this)

{
  shared_ptr<duckdb::Task,_true> this_ptr;
  enable_shared_from_this<duckdb::Task> local_20;
  
  enable_shared_from_this<duckdb::Task>::shared_from_this(&local_20);
  Executor::AddToBeRescheduled(this->executor,(shared_ptr<duckdb::Task,_true> *)&local_20);
  if (local_20.__weak_this_.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.__weak_this_.internal.
               super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ExecutorTask::Deschedule() {
	auto this_ptr = shared_from_this();
	executor.AddToBeRescheduled(this_ptr);
}